

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedType_,
          sysbvm_tuple_t environment_,sysbvm_tuple_t sourcePosition_)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t local_60;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t sStack_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_68;
  local_48 = 0;
  sStack_40 = 0;
  local_68 = astNode_;
  local_60 = expectedType_;
  local_58 = environment_;
  local_50 = sourcePosition_;
  if (astNode_ != 0) {
    sVar1 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,astNode_,expectedType_,environment_);
    return sVar1;
  }
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 6;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_48 = sysbvm_type_getDefaultValue(context,local_60);
  sStack_40 = sysbvm_astLiteralNode_create(context,local_48,local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_40;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedType_, sysbvm_tuple_t environment_, sysbvm_tuple_t sourcePosition_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedType;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourcePosition;

        sysbvm_tuple_t defaultValue;
        sysbvm_tuple_t result;
    } gcFrame = {
        .astNode = astNode_,
        .expectedType = expectedType_,
        .environment = environment_,
        .sourcePosition = sourcePosition_
    };

    if(!gcFrame.astNode)
    {
        SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
        gcFrame.defaultValue = sysbvm_type_getDefaultValue(context, gcFrame.expectedType);
        gcFrame.result = sysbvm_astLiteralNode_create(context, gcFrame.defaultValue, gcFrame.sourcePosition);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else
    {
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, gcFrame.expectedType, gcFrame.environment);
    }
}